

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O2

IfcMatrix4 *
Assimp::IFC::ProjectOntoPlane
          (IfcMatrix4 *__return_storage_ptr__,
          vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *out_contour,
          TempMesh *in_mesh,bool *ok,IfcVector3 *nor_out)

{
  pointer paVar1;
  pointer paVar2;
  undefined1 auVar3 [16];
  pointer paVar4;
  long lVar5;
  long lVar6;
  pointer paVar7;
  aiMatrix4x4t<double> *paVar8;
  aiMatrix4x4t<double> *paVar9;
  IfcMatrix4 *pIVar10;
  IfcVector3 *x;
  byte bVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  aiVector2t<double> aVar15;
  double dVar16;
  pointer local_1c0;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *__range2;
  pointer local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [48];
  aiVector2t<double> local_168;
  double local_158;
  aiVector2t<double> local_148;
  aiMatrix4x4t<double> local_138;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> out_contour2;
  
  bVar11 = 0;
  *ok = true;
  DerivePlaneCoordinateSpace((IfcMatrix3 *)&out_contour2,in_mesh,ok,nor_out);
  local_138.a1 = (double)out_contour2.
                         super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
  local_138.a2 = (double)out_contour2.
                         super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
  local_138.a3 = (double)out_contour2.
                         super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_138.a4 = 0.0;
  local_138.b4 = 0.0;
  local_138.c4 = 0.0;
  local_138.d1 = 0.0;
  local_138.d2 = 0.0;
  local_138.d3 = 0.0;
  local_138.d4 = 1.0;
  if (*ok == false) {
    __return_storage_ptr__->a1 = 1.0;
    __return_storage_ptr__->a2 = 0.0;
    __return_storage_ptr__->a3 = 0.0;
    __return_storage_ptr__->a4 = 0.0;
    __return_storage_ptr__->b1 = 0.0;
    __return_storage_ptr__->b2 = 1.0;
    __return_storage_ptr__->b3 = 0.0;
    __return_storage_ptr__->b4 = 0.0;
    __return_storage_ptr__->c1 = 0.0;
    __return_storage_ptr__->c2 = 0.0;
    __return_storage_ptr__->c3 = 1.0;
    __return_storage_ptr__->c4 = 0.0;
    __return_storage_ptr__->d1 = 0.0;
    __return_storage_ptr__->d2 = 0.0;
    __return_storage_ptr__->d3 = 0.0;
    __return_storage_ptr__->d4 = 1.0;
  }
  else {
    dVar12 = aiMatrix4x4t<double>::Determinant(&local_138);
    if (1e-05 <= ABS(dVar12 + -1.0)) {
      __assert_fail("std::fabs(det-1) < 1e-5",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCOpenings.cpp"
                    ,0x42e,
                    "IfcMatrix4 Assimp::IFC::ProjectOntoPlane(std::vector<IfcVector2> &, const TempMesh &, bool &, IfcVector3 &)"
                   );
    }
    std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::reserve
              (out_contour,
               ((long)(in_mesh->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(in_mesh->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18);
    paVar7 = (in_mesh->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    paVar1 = (in_mesh->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_1a8._8_8_ = 0xc202a05f20000000;
    local_1a8._0_8_ = 0xc202a05f20000000;
    local_198._8_8_ = 0x4202a05f20000000;
    local_198._0_8_ = 0x4202a05f20000000;
    local_1b0 = (pointer)0x4202a05f20000000;
    local_1c0 = (pointer)0xc202a05f20000000;
    for (; auVar3 = _DAT_005ca340, paVar7 != paVar1; paVar7 = paVar7 + 1) {
      ::operator*(&local_138,paVar7);
      if ((double)out_contour2.
                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage <= (double)local_1b0) {
        local_1b0 = out_contour2.
                    super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      local_168.y = (double)out_contour2.
                            super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
      local_168.x = (double)out_contour2.
                            super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
      local_198._0_16_ = minpd(local_198._0_16_,(undefined1  [16])local_168);
      local_1a8 = maxpd(local_1a8,(undefined1  [16])local_168);
      if ((double)local_1c0 <=
          (double)out_contour2.
                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_1c0 = out_contour2.
                    super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
      emplace_back<aiVector2t<double>>
                ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out_contour,
                 &local_168);
    }
    paVar2 = (out_contour->
             super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (paVar4 = (out_contour->
                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
                  _M_impl.super__Vector_impl_data._M_start; paVar4 != paVar2; paVar4 = paVar4 + 1) {
      auVar13._0_8_ = paVar4->x - (double)local_198._0_8_;
      auVar13._8_8_ = paVar4->y - (double)local_198._8_8_;
      auVar14._8_8_ = (double)local_1a8._8_8_ - (double)local_198._8_8_;
      auVar14._0_8_ = (double)local_1a8._0_8_ - (double)local_198._0_8_;
      auVar14 = divpd(auVar13,auVar14);
      auVar14 = maxpd(ZEXT816(0),auVar14);
      aVar15 = (aiVector2t<double>)minpd(auVar3,auVar14);
      *paVar4 = aVar15;
    }
    out_contour2.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    out_contour2.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    out_contour2.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)(1.0 / ((double)local_1a8._0_8_ - (double)local_198._0_8_));
    aiMatrix4x4t<double>::operator*=((aiMatrix4x4t<double> *)&out_contour2,&local_138);
    paVar8 = (aiMatrix4x4t<double> *)&out_contour2;
    paVar9 = &local_138;
    for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
      paVar9->a1 = paVar8->a1;
      paVar8 = (aiMatrix4x4t<double> *)((long)paVar8 + (ulong)bVar11 * -0x10 + 8);
      paVar9 = (aiMatrix4x4t<double> *)((long)paVar9 + (ulong)bVar11 * -0x10 + 8);
    }
    out_contour2.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    out_contour2.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    out_contour2.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    paVar1 = (in_mesh->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (paVar7 = (in_mesh->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start; paVar7 != paVar1; paVar7 = paVar7 + 1) {
      ::operator*(&local_138,paVar7);
      local_148.x = local_168.x;
      local_148.y = local_168.y;
      std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
      emplace_back<aiVector2t<double>>
                ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)&out_contour2,
                 &local_148);
      if (((double)local_1c0 - (double)local_1b0) + 1e-08 <= ABS(local_158)) {
        __assert_fail("std::fabs(vv.z) < vmax.z + 1e-8",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCOpenings.cpp"
                      ,0x46a,
                      "IfcMatrix4 Assimp::IFC::ProjectOntoPlane(std::vector<IfcVector2> &, const TempMesh &, bool &, IfcVector3 &)"
                     );
      }
    }
    paVar4 = (out_contour->
             super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = ((long)(out_contour->
                   super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)paVar4 >> 4) + 1;
    lVar5 = 8;
    while (lVar6 = lVar6 + -1, lVar6 != 0) {
      dVar12 = *(double *)((long)paVar4 + lVar5 + -8) -
               *(double *)
                ((long)out_contour2.
                       super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar5 + -8);
      dVar16 = *(double *)((long)&paVar4->x + lVar5) -
               *(double *)
                ((long)&(out_contour2.
                         super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->x + lVar5);
      lVar5 = lVar5 + 0x10;
      if (1e-06 <= dVar12 * dVar12 + dVar16 * dVar16) {
        __assert_fail("(out_contour[i]-out_contour2[i]).SquareLength() < 1e-6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCOpenings.cpp"
                      ,0x46e,
                      "IfcMatrix4 Assimp::IFC::ProjectOntoPlane(std::vector<IfcVector2> &, const TempMesh &, bool &, IfcVector3 &)"
                     );
      }
    }
    paVar8 = &local_138;
    pIVar10 = __return_storage_ptr__;
    for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
      pIVar10->a1 = paVar8->a1;
      paVar8 = (aiMatrix4x4t<double> *)((long)paVar8 + ((ulong)bVar11 * -2 + 1) * 8);
      pIVar10 = (IfcMatrix4 *)((long)pIVar10 + (ulong)bVar11 * -0x10 + 8);
    }
    std::_Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::~_Vector_base
              (&out_contour2.
                super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>);
  }
  return __return_storage_ptr__;
}

Assistant:

IfcMatrix4 ProjectOntoPlane(std::vector<IfcVector2>& out_contour, const TempMesh& in_mesh,
    bool &ok, IfcVector3& nor_out)
{
    const std::vector<IfcVector3>& in_verts = in_mesh.mVerts;
    ok = true;

    IfcMatrix4 m = IfcMatrix4(DerivePlaneCoordinateSpace(in_mesh, ok, nor_out));
    if(!ok) {
        return IfcMatrix4();
    }
#ifdef ASSIMP_BUILD_DEBUG
    const IfcFloat det = m.Determinant();
    ai_assert(std::fabs(det-1) < 1e-5);
#endif

    IfcFloat zcoord = 0;
    out_contour.reserve(in_verts.size());


    IfcVector3 vmin, vmax;
    MinMaxChooser<IfcVector3>()(vmin, vmax);

    // Project all points into the new coordinate system, collect min/max verts on the way
    for(const IfcVector3& x : in_verts) {
        const IfcVector3 vv = m * x;
        // keep Z offset in the plane coordinate system. Ignoring precision issues
        // (which  are present, of course), this should be the same value for
        // all polygon vertices (assuming the polygon is planar).

        // XXX this should be guarded, but we somehow need to pick a suitable
        // epsilon
        // if(coord != -1.0f) {
        //  assert(std::fabs(coord - vv.z) < 1e-3f);
        // }
        zcoord += vv.z;
        vmin = std::min(vv, vmin);
        vmax = std::max(vv, vmax);

        out_contour.push_back(IfcVector2(vv.x,vv.y));
    }

    zcoord /= in_verts.size();

    // Further improve the projection by mapping the entire working set into
    // [0,1] range. This gives us a consistent data range so all epsilons
    // used below can be constants.
    vmax -= vmin;
    for(IfcVector2& vv : out_contour) {
        vv.x  = (vv.x - vmin.x) / vmax.x;
        vv.y  = (vv.y - vmin.y) / vmax.y;

        // sanity rounding
        vv = std::max(vv,IfcVector2());
        vv = std::min(vv,one_vec);
    }

    IfcMatrix4 mult;
    mult.a1 = static_cast<IfcFloat>(1.0) / vmax.x;
    mult.b2 = static_cast<IfcFloat>(1.0) / vmax.y;

    mult.a4 = -vmin.x * mult.a1;
    mult.b4 = -vmin.y * mult.b2;
    mult.c4 = -zcoord;
    m = mult * m;

    // debug code to verify correctness
#ifdef ASSIMP_BUILD_DEBUG
    std::vector<IfcVector2> out_contour2;
    for(const IfcVector3& x : in_verts) {
        const IfcVector3& vv = m * x;

        out_contour2.push_back(IfcVector2(vv.x,vv.y));
        ai_assert(std::fabs(vv.z) < vmax.z + 1e-8);
    }

    for(size_t i = 0; i < out_contour.size(); ++i) {
        ai_assert((out_contour[i]-out_contour2[i]).SquareLength() < 1e-6);
    }
#endif

    return m;
}